

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O0

void __thiscall
cmServer::WriteProgress
          (cmServer *this,cmServerRequest *request,int min,int current,int max,string *message)

{
  long lVar1;
  Value *pVVar2;
  Value local_180;
  Value local_158;
  Value local_130;
  Value local_108;
  Value local_e0;
  Value local_b8;
  Value local_80;
  undefined1 local_58 [8];
  Value obj;
  string *message_local;
  int max_local;
  int current_local;
  int min_local;
  cmServerRequest *request_local;
  cmServer *this_local;
  
  obj.limit_ = (size_t)message;
  if (current < min || max < current) {
    __assert_fail("min <= current && current <= max",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServer.cxx"
                  ,0x13b,
                  "void cmServer::WriteProgress(const cmServerRequest &, int, int, int, const std::string &) const"
                 );
  }
  lVar1 = std::__cxx11::string::length();
  if (lVar1 != 0) {
    Json::Value::Value((Value *)local_58,objectValue);
    Json::Value::Value(&local_80,&kPROGRESS_TYPE_abi_cxx11_);
    pVVar2 = Json::Value::operator[]((Value *)local_58,&kTYPE_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar2,&local_80);
    Json::Value::~Value(&local_80);
    Json::Value::Value(&local_b8,&request->Type);
    pVVar2 = Json::Value::operator[]((Value *)local_58,&kREPLY_TO_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar2,&local_b8);
    Json::Value::~Value(&local_b8);
    Json::Value::Value(&local_e0,&request->Cookie);
    pVVar2 = Json::Value::operator[]((Value *)local_58,&kCOOKIE_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar2,&local_e0);
    Json::Value::~Value(&local_e0);
    Json::Value::Value(&local_108,(string *)obj.limit_);
    pVVar2 = Json::Value::operator[]((Value *)local_58,&kPROGRESS_MESSAGE_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar2,&local_108);
    Json::Value::~Value(&local_108);
    Json::Value::Value(&local_130,min);
    pVVar2 = Json::Value::operator[]((Value *)local_58,&kPROGRESS_MINIMUM_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar2,&local_130);
    Json::Value::~Value(&local_130);
    Json::Value::Value(&local_158,max);
    pVVar2 = Json::Value::operator[]((Value *)local_58,&kPROGRESS_MAXIMUM_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar2,&local_158);
    Json::Value::~Value(&local_158);
    Json::Value::Value(&local_180,current);
    pVVar2 = Json::Value::operator[]((Value *)local_58,&kPROGRESS_CURRENT_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar2,&local_180);
    Json::Value::~Value(&local_180);
    WriteJsonObject(this,request->Connection,(Value *)local_58,(DebugInfo *)0x0);
    Json::Value::~Value((Value *)local_58);
    return;
  }
  __assert_fail("message.length() != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServer.cxx"
                ,0x13c,
                "void cmServer::WriteProgress(const cmServerRequest &, int, int, int, const std::string &) const"
               );
}

Assistant:

void cmServer::WriteProgress(const cmServerRequest& request, int min,
                             int current, int max,
                             const std::string& message) const
{
  assert(min <= current && current <= max);
  assert(message.length() != 0);

  Json::Value obj = Json::objectValue;
  obj[kTYPE_KEY] = kPROGRESS_TYPE;
  obj[kREPLY_TO_KEY] = request.Type;
  obj[kCOOKIE_KEY] = request.Cookie;
  obj[kPROGRESS_MESSAGE_KEY] = message;
  obj[kPROGRESS_MINIMUM_KEY] = min;
  obj[kPROGRESS_MAXIMUM_KEY] = max;
  obj[kPROGRESS_CURRENT_KEY] = current;

  this->WriteJsonObject(request.Connection, obj, nullptr);
}